

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall
imrt::Collimator::generateIntensityLevels(Collimator *this,int step_intensity,int max_intensity)

{
  mapped_type *pmVar1;
  int in_EDX;
  int in_ESI;
  value_type_conflict2 *in_RDI;
  int i;
  int aux;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  Collimator *in_stack_ffffffffffffffc0;
  undefined4 local_34;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  
  uVar4 = 0;
  uVar3 = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  pmVar1 = std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         *)CONCAT44(in_ESI,in_EDX),(key_type_conflict1 *)CONCAT44(uVar4,uVar3));
  *pmVar1 = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  pmVar1 = std::map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
           ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         *)CONCAT44(in_ESI,in_EDX),(key_type_conflict1 *)CONCAT44(uVar4,uVar3));
  *pmVar1 = 1;
  iVar5 = 1;
  local_34 = 2;
  while (iVar5 < in_EDX) {
    iVar5 = iVar5 + in_ESI;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,in_RDI);
    in_stack_ffffffffffffffc0 = (Collimator *)(double)iVar5;
    iVar2 = local_34;
    pmVar1 = std::
             map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
             operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                         *)CONCAT44(in_ESI,in_EDX),(key_type_conflict1 *)CONCAT44(iVar5,uVar3));
    *pmVar1 = iVar2;
    local_34 = local_34 + 1;
  }
  printIntensityLevels(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void Collimator::generateIntensityLevels (int step_intensity, int max_intensity) {
    int aux=0;
    // Level 0 and 1 are always in the set
    levels_to_intensity.push_back(0);
    intensity_to_levels[0.0] = 0;
    levels_to_intensity.push_back(1);
    intensity_to_levels[1.0] = 1;
    aux = 1;

    for (int i=2; aux< max_intensity; i++){
      aux = aux + step_intensity;
      levels_to_intensity.push_back(aux);
      intensity_to_levels[aux] = i;
    }
    printIntensityLevels ();
  }